

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_keterangan(void)

{
  allocator local_1c9;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  
  KumpulanKubus::print(kubus,(FrameBuffer *)fb);
  std::__cxx11::string::string(local_28,"STEI",&local_1c9);
  Font::print(&font,fb,local_28,0x44c,100,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string(local_48,"FMIPA",&local_1c9);
  Font::print(&font,fb,local_48,0x44c,0x78,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string(local_68,"FSRD",&local_1c9);
  Font::print(&font,fb,local_68,0x44c,0x8c,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::string(local_88,"SAPPK",&local_1c9);
  Font::print(&font,fb,local_88,0x44c,0xa0,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::string(local_a8,"FTTM",&local_1c9);
  Font::print(&font,fb,local_a8,0x44c,0xb4,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::string(local_c8,"SITH",&local_1c9);
  Font::print(&font,fb,local_c8,0x44c,200,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::string(local_e8,"FTI",&local_1c9);
  Font::print(&font,fb,local_e8,0x44c,0xdc,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::string(local_108,"FITB",&local_1c9);
  Font::print(&font,fb,local_108,0x44c,0xf0,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::string(local_128,"FTMD",&local_1c9);
  Font::print(&font,fb,local_128,0x44c,0x104,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::string(local_148,"FTSL",&local_1c9);
  Font::print(&font,fb,local_148,0x44c,0x118,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::string(local_168,"SF",&local_1c9);
  Font::print(&font,fb,local_168,0x44c,300,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::string(local_188,"SBM",&local_1c9);
  Font::print(&font,fb,local_188,0x44c,0x140,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::string(local_1a8,"UMUM",&local_1c9);
  Font::print(&font,fb,local_1a8,0x44c,0x154,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::string(local_1c8,"OTHER",&local_1c9);
  Font::print(&font,fb,local_1c8,0x44c,0x168,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_1c8);
  return;
}

Assistant:

void print_keterangan() {
  kubus->print(fb);
  font.print(fb, "STEI", UJUNG_X2, UJUNG_Y2, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FMIPA", UJUNG_X2, UJUNG_Y2+20, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FSRD", UJUNG_X2, UJUNG_Y2+40, FONT_SIZE2, Color::WHITE);
  font.print(fb, "SAPPK", UJUNG_X2, UJUNG_Y2+60, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FTTM", UJUNG_X2, UJUNG_Y2+80, FONT_SIZE2, Color::WHITE);
  font.print(fb, "SITH", UJUNG_X2, UJUNG_Y2+100, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FTI", UJUNG_X2, UJUNG_Y2+120, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FITB", UJUNG_X2, UJUNG_Y2+140, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FTMD", UJUNG_X2, UJUNG_Y2+160, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FTSL", UJUNG_X2, UJUNG_Y2+180, FONT_SIZE2, Color::WHITE);
  font.print(fb, "SF", UJUNG_X2, UJUNG_Y2+200, FONT_SIZE2, Color::WHITE);
  font.print(fb, "SBM", UJUNG_X2, UJUNG_Y2+220, FONT_SIZE2, Color::WHITE);
  font.print(fb, "UMUM", UJUNG_X2, UJUNG_Y2+240, FONT_SIZE2, Color::WHITE);
  font.print(fb, "OTHER", UJUNG_X2, UJUNG_Y2+260, FONT_SIZE2, Color::WHITE);
}